

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_GetThis(Var thisVar,int moduleID,ScriptContextInfo *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  RecyclableObject *this;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  TypeId TStack_40;
  
  if (thisVar == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_0099fcb6;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(thisVar);
  if (bVar2) {
    TStack_40 = TypeIds_FirstNumberType;
    goto LAB_0099fb76;
  }
  if ((ulong)thisVar >> 0x32 != 0) {
    TStack_40 = TypeIds_Number;
    goto LAB_0099fb76;
  }
  this = UnsafeVarTo<Js::RecyclableObject>(thisVar);
  if (this == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_0099fcb6;
    *puVar4 = 0;
  }
  TStack_40 = ((this->type).ptr)->typeId;
  if ((int)TStack_40 < 0x58) {
    if (0x3a < TStack_40 - TypeIds_HostDispatch) goto LAB_0099fb76;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
    ;
    error = "(!JavascriptOperators::IsThisSelf(typeId))";
    message = "!JavascriptOperators::IsThisSelf(typeId)";
    lineNumber = 0x155e;
  }
  else {
    BVar3 = RecyclableObject::IsExternal(this);
    if (BVar3 != 0) goto LAB_0099fb76;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  bVar2 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar2) {
LAB_0099fcb6:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_0099fb76:
  pvVar5 = GetThisHelper(thisVar,TStack_40,moduleID,scriptContext);
  return pvVar5;
}

Assistant:

Var JavascriptOperators::OP_GetThis(Var thisVar, int moduleID, ScriptContextInfo* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(LdThis);
        //
        // if "this" is null or undefined
        //   Pass the global object
        // Else
        //   Pass ToObject(this)
        //
        TypeId typeId = JavascriptOperators::GetTypeId(thisVar);

        Assert(!JavascriptOperators::IsThisSelf(typeId));

        return JavascriptOperators::GetThisHelper(thisVar, typeId, moduleID, scriptContext);
        JIT_HELPER_END(LdThis);
    }